

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double llvm::detail::frexp(double __x,int *__exponent)

{
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  double extraout_XMM0_Qa_01;
  double dVar2;
  int local_54;
  IEEEFloat local_40;
  undefined1 local_25;
  int *piStack_20;
  roundingMode RM_local;
  int *Exp_local;
  IEEEFloat *Val_local;
  IEEEFloat *Quiet;
  
  piStack_20 = in_RDX;
  Exp_local = in_RSI;
  Val_local = (IEEEFloat *)__exponent;
  iVar1 = ilogb(__x);
  *piStack_20 = iVar1;
  if (*piStack_20 == -0x80000000) {
    local_25 = 0;
    IEEEFloat::IEEEFloat((IEEEFloat *)__exponent,(IEEEFloat *)Exp_local);
    IEEEFloat::makeQuiet((IEEEFloat *)__exponent);
    dVar2 = extraout_XMM0_Qa;
  }
  else if (*piStack_20 == 0x7fffffff) {
    IEEEFloat::IEEEFloat((IEEEFloat *)__exponent,(IEEEFloat *)Exp_local);
    dVar2 = extraout_XMM0_Qa_00;
  }
  else {
    if (*piStack_20 == -0x7fffffff) {
      local_54 = 0;
    }
    else {
      local_54 = *piStack_20 + 1;
    }
    *piStack_20 = local_54;
    IEEEFloat::IEEEFloat(&local_40,(IEEEFloat *)Exp_local);
    scalbn(__x_00,(int)__exponent);
    IEEEFloat::~IEEEFloat(&local_40);
    dVar2 = extraout_XMM0_Qa_01;
  }
  return dVar2;
}

Assistant:

IEEEFloat frexp(const IEEEFloat &Val, int &Exp, IEEEFloat::roundingMode RM) {
  Exp = ilogb(Val);

  // Quiet signalling nans.
  if (Exp == IEEEFloat::IEK_NaN) {
    IEEEFloat Quiet(Val);
    Quiet.makeQuiet();
    return Quiet;
  }

  if (Exp == IEEEFloat::IEK_Inf)
    return Val;

  // 1 is added because frexp is defined to return a normalized fraction in
  // +/-[0.5, 1.0), rather than the usual +/-[1.0, 2.0).
  Exp = Exp == IEEEFloat::IEK_Zero ? 0 : Exp + 1;
  return scalbn(Val, -Exp, RM);
}